

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintYaml(ConvertToolPrivate *this,BamAlignment *a)

{
  ostream *poVar1;
  pointer pCVar2;
  ostream *poVar3;
  CigarOp *op;
  pointer pCVar4;
  
  poVar1 = &this->m_out;
  poVar3 = std::operator<<(poVar1,"---");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,(string *)a);
  poVar3 = std::operator<<(poVar3,':');
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"AlndBases: ");
  poVar3 = std::operator<<(poVar3,(string *)&a->AlignedBases);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"Qualities: ");
  poVar3 = std::operator<<(poVar3,(string *)&a->Qualities);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"Name: ");
  poVar3 = std::operator<<(poVar3,(string *)a);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"Length: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->Length);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"TagData: ");
  poVar3 = std::operator<<(poVar3,(string *)&a->TagData);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"RefID: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->RefID);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"RefName: ");
  poVar3 = std::operator<<(poVar3,(string *)
                                  ((this->m_references).
                                   super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>
                                   ._M_impl.super__Vector_impl_data._M_start + a->RefID));
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"Position: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->Position);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"Bin: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->Bin);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"MapQuality: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->MapQuality);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"AlignmentFlag: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"MateRefID: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->MateRefID);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"MatePosition: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->MatePosition);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"InsertSize: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,a->InsertSize);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<(poVar1,"   ");
  poVar3 = std::operator<<(poVar3,"Filename: ");
  poVar3 = std::operator<<(poVar3,(string *)&a->Filename);
  std::endl<char,std::char_traits<char>>(poVar3);
  if ((a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    poVar3 = std::operator<<(poVar1,"   ");
    std::operator<<(poVar3,"Cigar: ");
    pCVar2 = (a->CigarData).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pCVar4 = (a->CigarData).
                  super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                  super__Vector_impl_data._M_start; pCVar4 != pCVar2; pCVar4 = pCVar4 + 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<(poVar3,pCVar4->Type);
    }
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintYaml(const BamAlignment& a)
{

    // write alignment name
    m_out << "---" << std::endl;
    m_out << a.Name << ':' << std::endl;

    // write alignment data
    m_out << "   "
          << "AlndBases: " << a.AlignedBases << std::endl;
    m_out << "   "
          << "Qualities: " << a.Qualities << std::endl;
    m_out << "   "
          << "Name: " << a.Name << std::endl;
    m_out << "   "
          << "Length: " << a.Length << std::endl;
    m_out << "   "
          << "TagData: " << a.TagData << std::endl;
    m_out << "   "
          << "RefID: " << a.RefID << std::endl;
    m_out << "   "
          << "RefName: " << m_references[a.RefID].RefName << std::endl;
    m_out << "   "
          << "Position: " << a.Position << std::endl;
    m_out << "   "
          << "Bin: " << a.Bin << std::endl;
    m_out << "   "
          << "MapQuality: " << a.MapQuality << std::endl;
    m_out << "   "
          << "AlignmentFlag: " << a.AlignmentFlag << std::endl;
    m_out << "   "
          << "MateRefID: " << a.MateRefID << std::endl;
    m_out << "   "
          << "MatePosition: " << a.MatePosition << std::endl;
    m_out << "   "
          << "InsertSize: " << a.InsertSize << std::endl;
    m_out << "   "
          << "Filename: " << a.Filename << std::endl;

    // write Cigar data
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (!cigarData.empty()) {
        m_out << "   "
              << "Cigar: ";
        std::vector<CigarOp>::const_iterator cigarBegin = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarIter = cigarBegin;
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << std::endl;
    }
}